

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::internal::String::FormatHexUInt32_abi_cxx11_
          (string *__return_storage_ptr__,String *this,UInt32 value)

{
  void *pvVar1;
  stringstream local_1a0 [8];
  stringstream ss;
  undefined1 auStack_190 [380];
  uint local_14;
  string *psStack_10;
  UInt32 value_local;
  
  local_14 = (uint)this;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  pvVar1 = (void *)std::ostream::operator<<(auStack_190,std::hex);
  pvVar1 = (void *)std::ostream::operator<<(pvVar1,std::uppercase);
  std::ostream::operator<<(pvVar1,local_14);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string String::FormatHexUInt32(UInt32 value) {
  std::stringstream ss;
  ss << std::hex << std::uppercase << value;
  return ss.str();
}